

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
TestCharReaderTestparseChineseWithOneError::~TestCharReaderTestparseChineseWithOneError
          (TestCharReaderTestparseChineseWithOneError *this)

{
  JsonTest::TestCase::~TestCase((TestCase *)this);
  operator_delete(this);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseChineseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"pr佐藤erty\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 19\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}